

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char_*,_char>_>::write
          (arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *this,int __fd,void *__buf,
          size_t __n)

{
  format_specs *spec;
  iterator __dest;
  void *extraout_RAX;
  void *pvVar1;
  ulong uVar2;
  char **it;
  ptrdiff_t _Num;
  ulong __n_00;
  str_writer<char> local_28;
  
  local_28.s = "false";
  if (__fd != 0) {
    local_28.s = "true";
  }
  __n_00 = (ulong)(uint)__fd ^ 5;
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    __dest = (this->writer_).out_;
    pvVar1 = memcpy(__dest,local_28.s,__n_00);
    (this->writer_).out_ = __dest + __n_00;
  }
  else {
    uVar2 = (ulong)(spec->super_core_format_specs).precision;
    local_28.size_ = __n_00;
    if (uVar2 < __n_00) {
      local_28.size_ = uVar2;
    }
    if ((long)uVar2 < 0) {
      local_28.size_ = __n_00;
    }
    basic_writer<fmt::v5::output_range<char*,char>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<char*,char>> *)this,&spec->super_align_spec,
               &local_28);
    pvVar1 = extraout_RAX;
  }
  return (ssize_t)pvVar1;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }